

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O0

int __thiscall QTreeView::sizeHintForColumn(QTreeView *this,int column)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  QTreeViewPrivate *this_00;
  qsizetype qVar7;
  int *piVar8;
  const_reference pQVar9;
  long *in_RDI;
  long in_FS_OFFSET;
  int idx;
  int actualBottom;
  int i;
  int rowsProcessed;
  int remainingHeight;
  int end;
  int start;
  int maximumProcessRows;
  int w;
  QTreeViewPrivate *d;
  QModelIndex index_1;
  QModelIndex index;
  int offset;
  QList<QTreeViewItem> viewItems;
  QStyleOptionViewItem option;
  undefined4 in_stack_fffffffffffffe38;
  undefined1 in_stack_fffffffffffffe3c;
  undefined1 in_stack_fffffffffffffe3d;
  undefined1 in_stack_fffffffffffffe3e;
  undefined1 uVar10;
  undefined1 in_stack_fffffffffffffe3f;
  QAbstractItemViewPrivate *in_stack_fffffffffffffe40;
  undefined4 in_stack_fffffffffffffe50;
  int in_stack_fffffffffffffe54;
  int iVar11;
  undefined4 in_stack_fffffffffffffe58;
  int in_stack_fffffffffffffe5c;
  undefined4 in_stack_fffffffffffffe60;
  int iVar12;
  int in_stack_fffffffffffffe64;
  undefined4 in_stack_fffffffffffffe68;
  undefined4 in_stack_fffffffffffffe6c;
  int local_16c;
  undefined8 local_160;
  undefined1 *local_150;
  quintptr in_stack_fffffffffffffeb8;
  undefined1 *local_120;
  undefined1 *local_118;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_110;
  int local_104 [3];
  int local_f8 [2];
  QList<QTreeViewItem> local_f0;
  undefined1 local_d8 [208];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QTreeView *)0x8ff204);
  QAbstractItemViewPrivate::executePostedLayout(in_stack_fffffffffffffe40);
  bVar1 = QList<QTreeViewItem>::isEmpty((QList<QTreeViewItem> *)0x8ff224);
  if (bVar1) {
    local_16c = -1;
    goto LAB_008ff7c8;
  }
  QWidget::ensurePolished((QWidget *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
  local_16c = 0;
  memset(local_d8,0xaa,0xd0);
  QStyleOptionViewItem::QStyleOptionViewItem((QStyleOptionViewItem *)0x8ff26d);
  (**(code **)(*in_RDI + 0x2f8))(in_RDI,local_d8);
  local_f0.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_f0.d.ptr = (QTreeViewItem *)&DAT_aaaaaaaaaaaaaaaa;
  local_f0.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  QList<QTreeViewItem>::QList
            ((QList<QTreeViewItem> *)in_stack_fffffffffffffe40,
             (QList<QTreeViewItem> *)
             CONCAT17(in_stack_fffffffffffffe3f,
                      CONCAT16(in_stack_fffffffffffffe3e,
                               CONCAT15(in_stack_fffffffffffffe3d,
                                        CONCAT14(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38
                                                )))));
  iVar2 = QHeaderView::resizeContentsPrecision((QHeaderView *)in_stack_fffffffffffffe40);
  local_f8[1] = 0;
  iVar3 = QTreeViewPrivate::firstVisibleItem(this_00,(int *)CONCAT44(local_16c,iVar2));
  iVar4 = QTreeViewPrivate::lastVisibleItem
                    ((QTreeViewPrivate *)
                     CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                     in_stack_fffffffffffffe5c,iVar3);
  if ((iVar3 < 0) || (iVar4 < 0)) {
LAB_008ff352:
    qVar7 = QList<QTreeViewItem>::size(&local_f0);
    iVar4 = (int)qVar7 + -1;
    if (iVar2 < 0) {
      iVar3 = 0;
    }
    else if (iVar2 == 0) {
      local_f8[0] = 0;
      local_104[2] = (int)qVar7 + -2;
      piVar8 = qMax<int>(local_f8,local_104 + 2);
      iVar3 = *piVar8;
      QAbstractScrollArea::viewport((QAbstractScrollArea *)in_stack_fffffffffffffe40);
      in_stack_fffffffffffffe64 = QWidget::height((QWidget *)0x8ff3cc);
      for (; in_stack_fffffffffffffe3f = 0 < iVar3 && 0 < in_stack_fffffffffffffe64,
          0 < iVar3 && 0 < in_stack_fffffffffffffe64; iVar3 = iVar3 + -1) {
        iVar5 = QTreeViewPrivate::itemHeight
                          ((QTreeViewPrivate *)
                           CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
                           in_stack_fffffffffffffe54);
        in_stack_fffffffffffffe64 = in_stack_fffffffffffffe64 - iVar5;
      }
    }
    else {
      local_104[1] = 0;
      local_104[0] = iVar4 - iVar2;
      piVar8 = qMax<int>(local_104 + 1,local_104);
      iVar3 = *piVar8;
    }
  }
  else {
    in_stack_fffffffffffffe40 = (QAbstractItemViewPrivate *)(long)iVar4;
    qVar7 = QList<QTreeViewItem>::size(&local_f0);
    if (in_stack_fffffffffffffe40 == (QAbstractItemViewPrivate *)(qVar7 + -1)) goto LAB_008ff352;
  }
  iVar12 = 0;
  iVar5 = iVar3;
  for (; iVar3 <= iVar4; iVar3 = iVar3 + 1) {
    pQVar9 = QList<QTreeViewItem>::at
                       ((QList<QTreeViewItem> *)in_stack_fffffffffffffe40,
                        CONCAT17(in_stack_fffffffffffffe3f,
                                 CONCAT16(in_stack_fffffffffffffe3e,
                                          CONCAT15(in_stack_fffffffffffffe3d,
                                                   CONCAT14(in_stack_fffffffffffffe3c,
                                                            in_stack_fffffffffffffe38)))));
    if ((*(ulong *)&pQVar9->field_0x1c >> 1 & 1) == 0) {
      local_120 = &DAT_aaaaaaaaaaaaaaaa;
      local_118 = &DAT_aaaaaaaaaaaaaaaa;
      local_110.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
      pQVar9 = QList<QTreeViewItem>::at
                         ((QList<QTreeViewItem> *)in_stack_fffffffffffffe40,
                          CONCAT17(in_stack_fffffffffffffe3f,
                                   CONCAT16(in_stack_fffffffffffffe3e,
                                            CONCAT15(in_stack_fffffffffffffe3d,
                                                     CONCAT14(in_stack_fffffffffffffe3c,
                                                              in_stack_fffffffffffffe38)))));
      local_120._0_4_ = (pQVar9->index).r;
      local_120._4_4_ = (pQVar9->index).c;
      local_118 = (undefined1 *)(pQVar9->index).i;
      local_110.ptr = (pQVar9->index).m.ptr;
      QModelIndex::row((QModelIndex *)&local_120);
      QModelIndex::sibling
                ((QModelIndex *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                 (int)((ulong)in_RDI >> 0x20),(int)in_RDI);
      local_16c = QTreeViewPrivate::widthHintForIndex
                            (this_00,(QModelIndex *)CONCAT44(local_16c,iVar2),
                             (int)(in_stack_fffffffffffffeb8 >> 0x20),
                             (QStyleOptionViewItem *)CONCAT44(iVar5,iVar4),in_stack_fffffffffffffe64
                            );
      iVar12 = iVar12 + 1;
      if (iVar12 == iVar2) break;
    }
  }
  iVar4 = iVar4 + -1;
  qVar7 = QList<QTreeViewItem>::size(&local_f0);
  iVar3 = (int)qVar7 + -1;
  if (iVar2 == 0) {
    iVar12 = 0;
  }
  while( true ) {
    bVar1 = iVar12 != iVar2;
    if (bVar1) {
      in_stack_fffffffffffffe3d = 0 < iVar5 || iVar4 < iVar3;
    }
    uVar10 = bVar1 && (0 < iVar5 || iVar4 < iVar3);
    if (!bVar1 || 0 >= iVar5 && iVar4 >= iVar3) break;
    iVar11 = -1;
    if (((iVar12 % 2 == 0) || (iVar5 < 1)) && (iVar4 != iVar3)) {
      do {
        iVar6 = iVar11;
        if (iVar3 <= iVar4) break;
        iVar6 = iVar4 + 1;
        pQVar9 = QList<QTreeViewItem>::at
                           ((QList<QTreeViewItem> *)in_stack_fffffffffffffe40,
                            CONCAT17(in_stack_fffffffffffffe3f,
                                     CONCAT16(uVar10,CONCAT15(in_stack_fffffffffffffe3d,
                                                              CONCAT14(in_stack_fffffffffffffe3c,
                                                                       in_stack_fffffffffffffe38))))
                           );
        iVar4 = iVar6;
      } while ((*(ulong *)&pQVar9->field_0x1c >> 1 & 1) != 0);
    }
    else {
      do {
        iVar6 = iVar11;
        if (iVar5 < 1) break;
        iVar5 = iVar5 + -1;
        pQVar9 = QList<QTreeViewItem>::at
                           ((QList<QTreeViewItem> *)in_stack_fffffffffffffe40,
                            CONCAT17(in_stack_fffffffffffffe3f,
                                     CONCAT16(uVar10,CONCAT15(in_stack_fffffffffffffe3d,
                                                              CONCAT14(in_stack_fffffffffffffe3c,
                                                                       in_stack_fffffffffffffe38))))
                           );
        iVar6 = iVar5;
      } while ((*(ulong *)&pQVar9->field_0x1c >> 1 & 1) != 0);
    }
    if (-1 < iVar6) {
      local_150 = &DAT_aaaaaaaaaaaaaaaa;
      pQVar9 = QList<QTreeViewItem>::at
                         ((QList<QTreeViewItem> *)in_stack_fffffffffffffe40,
                          CONCAT17(in_stack_fffffffffffffe3f,
                                   CONCAT16(uVar10,CONCAT15(in_stack_fffffffffffffe3d,
                                                            CONCAT14(in_stack_fffffffffffffe3c,
                                                                     in_stack_fffffffffffffe38)))));
      local_150._0_4_ = (pQVar9->index).r;
      local_150._4_4_ = (pQVar9->index).c;
      QModelIndex::row((QModelIndex *)&local_150);
      QModelIndex::sibling
                ((QModelIndex *)CONCAT44(iVar6,in_stack_fffffffffffffe50),
                 (int)((ulong)in_RDI >> 0x20),(int)in_RDI);
      local_16c = QTreeViewPrivate::widthHintForIndex
                            (this_00,(QModelIndex *)CONCAT44(local_16c,iVar2),
                             (int)((ulong)local_160 >> 0x20),
                             (QStyleOptionViewItem *)CONCAT44(iVar5,iVar4),in_stack_fffffffffffffe64
                            );
      iVar12 = iVar12 + 1;
    }
  }
  QList<QTreeViewItem>::~QList((QList<QTreeViewItem> *)0x8ff7bb);
  QStyleOptionViewItem::~QStyleOptionViewItem((QStyleOptionViewItem *)in_stack_fffffffffffffe40);
LAB_008ff7c8:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_16c;
  }
  __stack_chk_fail();
}

Assistant:

int QTreeView::sizeHintForColumn(int column) const
{
    Q_D(const QTreeView);
    d->executePostedLayout();
    if (d->viewItems.isEmpty())
        return -1;
    ensurePolished();
    int w = 0;
    QStyleOptionViewItem option;
    initViewItemOption(&option);
    const QList<QTreeViewItem> viewItems = d->viewItems;

    const int maximumProcessRows = d->header->resizeContentsPrecision(); // To avoid this to take forever.

    int offset = 0;
    int start = d->firstVisibleItem(&offset);
    int end = d->lastVisibleItem(start, offset);
    if (start < 0 || end < 0 || end == viewItems.size() - 1) {
        end = viewItems.size() - 1;
        if (maximumProcessRows < 0) {
            start = 0;
        } else if (maximumProcessRows == 0) {
            start = qMax(0, end - 1);
            int remainingHeight = viewport()->height();
            while (start > 0 && remainingHeight > 0) {
                remainingHeight -= d->itemHeight(start);
                --start;
            }
        } else {
            start = qMax(0, end - maximumProcessRows);
        }
    }

    int rowsProcessed = 0;

    for (int i = start; i <= end; ++i) {
        if (viewItems.at(i).spanning)
            continue; // we have no good size hint
        QModelIndex index = viewItems.at(i).index;
        index = index.sibling(index.row(), column);
        w = d->widthHintForIndex(index, w, option, i);
        ++rowsProcessed;
        if (rowsProcessed == maximumProcessRows)
            break;
    }

    --end;
    int actualBottom = viewItems.size() - 1;

    if (maximumProcessRows == 0)
        rowsProcessed = 0; // skip the while loop

    while (rowsProcessed != maximumProcessRows && (start > 0 || end < actualBottom)) {
        int idx  = -1;

        if ((rowsProcessed % 2 && start > 0) || end == actualBottom) {
            while (start > 0) {
                --start;
                if (viewItems.at(start).spanning)
                    continue;
                idx = start;
                break;
            }
        } else {
            while (end < actualBottom) {
                ++end;
                if (viewItems.at(end).spanning)
                    continue;
                idx = end;
                break;
            }
        }
        if (idx < 0)
            continue;

        QModelIndex index = viewItems.at(idx).index;
        index = index.sibling(index.row(), column);
        w = d->widthHintForIndex(index, w, option, idx);
        ++rowsProcessed;
    }
    return w;
}